

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::ResolveContinues
          (SQCompiler *this,SQFuncState *funcstate,SQInteger ntoresolve,SQInteger targetpos)

{
  long in_RDX;
  long in_RSI;
  SQInteger in_RDI;
  SQInteger pos;
  undefined8 local_18;
  
  for (local_18 = in_RDX; 0 < local_18; local_18 = local_18 + -1) {
    sqvector<long_long>::back((sqvector<long_long> *)(in_RSI + 0x60));
    sqvector<long_long>::pop_back((sqvector<long_long> *)(in_RSI + 0x60));
    SQFuncState::SetInstructionParams
              ((SQFuncState *)this,(SQInteger)funcstate,ntoresolve,targetpos,pos,in_RDI);
  }
  return;
}

Assistant:

void ResolveContinues(SQFuncState *funcstate, SQInteger ntoresolve, SQInteger targetpos)
    {
        while(ntoresolve > 0) {
            SQInteger pos = funcstate->_unresolvedcontinues.back();
            funcstate->_unresolvedcontinues.pop_back();
            //set the jmp instruction
            funcstate->SetInstructionParams(pos, 0, targetpos - pos, 0);
            ntoresolve--;
        }
    }